

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O1

void robot_speed(SpurUserParamsPtr spur)

{
  ParametersPtr p_Var1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  lVar3 = 0;
  p_Var1 = get_param_ptr();
  iVar2 = 0;
  do {
    if (p_Var1->motor_enable[lVar3] != 0) {
      dVar4 = p(YP_PARAM_VEHICLE_CONTROL,(motor_id)lVar3);
      if (0.0 < dVar4) {
        spur->wheel_vel_smooth[lVar3] = 0.0;
        spur->wheel_mode[lVar3] = MOTOR_CONTROL_VEHICLE;
        if (iVar2 == 1) {
          dVar4 = spur->wref_smooth;
          dVar5 = p(YP_PARAM_TREAD,MOTOR_RIGHT);
          dVar4 = -(dVar5 * dVar4 * 0.5 - spur->vref_smooth);
LAB_00109343:
          dVar5 = p(YP_PARAM_RADIUS,(motor_id)lVar3);
          spur->wheel_vel_smooth[lVar3] = dVar4 / dVar5;
        }
        else if (iVar2 == 0) {
          dVar4 = spur->wref_smooth;
          dVar5 = p(YP_PARAM_TREAD,MOTOR_RIGHT);
          dVar4 = dVar5 * dVar4 * 0.5 + spur->vref_smooth;
          goto LAB_00109343;
        }
        iVar2 = iVar2 + 1;
      }
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void robot_speed(SpurUserParamsPtr spur)
{
  int i;
  int vc_i;

  ParametersPtr param;
  param = get_param_ptr();

  vc_i = 0;
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    if (!param->motor_enable[i])
      continue;

    if (p(YP_PARAM_VEHICLE_CONTROL, i) > 0)
    {
      spur->wheel_vel_smooth[i] = 0;
      spur->wheel_mode[i] = MOTOR_CONTROL_VEHICLE;

      switch (vc_i)
      {
        case 0:
          spur->wheel_vel_smooth[i] = (0.5 * spur->wref_smooth * p(YP_PARAM_TREAD, 0) + spur->vref_smooth) / p(YP_PARAM_RADIUS, i);
          break;
        case 1:
          spur->wheel_vel_smooth[i] = -(0.5 * spur->wref_smooth * p(YP_PARAM_TREAD, 0) - spur->vref_smooth) / p(YP_PARAM_RADIUS, i);
          break;
        default:
          break;
      }
      vc_i++;
    }
  }
}